

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

Token * __thiscall wabt::Token::operator=(Token *this,Token *other)

{
  TokenType TVar1;
  char *pcVar2;
  size_type sVar3;
  undefined8 uVar4;
  
  Destroy(this);
  pcVar2 = (other->loc).filename.data_;
  sVar3 = (other->loc).filename.size_;
  uVar4 = *(undefined8 *)((long)&(other->loc).field_1 + 8);
  (this->loc).field_1.field_1.offset = (other->loc).field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = uVar4;
  (this->loc).filename.data_ = pcVar2;
  (this->loc).filename.size_ = sVar3;
  TVar1 = other->token_type_;
  this->token_type_ = TVar1;
  if (TVar1 - First_Literal < 3) {
    Literal::Literal(&(this->field_2).literal_,&(other->field_2).literal_);
    return this;
  }
  if (0x33 < TVar1 - AtomicLoad) {
    if (TVar1 - AlignEqNat < 5) {
      std::__cxx11::string::string
                ((string *)&(this->field_2).text_,(string *)&(other->field_2).text_);
      return this;
    }
    if (TVar1 != First_Type) {
      return this;
    }
  }
  (this->field_2).type_ = (other->field_2).type_;
  return this;
}

Assistant:

Token& Token::operator=(const Token& other) {
  Destroy();
  loc = other.loc;
  token_type_ = other.token_type_;

  if (HasLiteral()) {
    Construct(literal_, other.literal_);
  } else if (HasOpcode()) {
    Construct(opcode_, other.opcode_);
  } else if (HasText()) {
    Construct(text_, other.text_);
  } else if (HasType()) {
    Construct(type_, other.type_);
  }

  return *this;
}